

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O0

FormulaUnit * __thiscall FOOLElimination::apply(FOOLElimination *this,FormulaUnit *unit)

{
  bool bVar1;
  FormulaUnit *this_00;
  FormulaUnit *pFVar2;
  List<Kernel::Unit_*> *pLVar3;
  ostream *poVar4;
  FormulaUnit *in_RSI;
  Inference *in_RDI;
  bool in_stack_0000001f;
  FormulaUnit *in_stack_00000020;
  FormulaUnit *processedUnit;
  Formula *processedFormula;
  Formula *formula;
  FormulaUnit *rectifiedUnit;
  Formula *in_stack_000002d0;
  FOOLElimination *in_stack_000002d8;
  NonspecificInferenceMany *in_stack_fffffffffffffee8;
  Options *in_stack_fffffffffffffef0;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_ffffffffffffff38;
  FormulaUnit *in_stack_ffffffffffffff40;
  FormulaUnit *in_stack_ffffffffffffff48;
  string local_a8 [35];
  undefined1 local_85;
  NonspecificInferenceMany local_78;
  Inference local_68;
  FormulaUnit *local_38;
  FormulaUnit *local_30;
  FormulaUnit *local_8;
  
  bVar1 = needsElimination(in_stack_ffffffffffffff48);
  local_8 = in_RSI;
  if (bVar1) {
    local_8 = Shell::Rectify::rectify(in_stack_00000020,in_stack_0000001f);
    this_00 = (FormulaUnit *)Kernel::FormulaUnit::formula(local_8);
    *(FormulaUnit **)in_RDI = local_8;
    Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
              ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
               &in_RDI->_ptr2);
    Kernel::SortHelper::collectVariableSorts
              ((Formula *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               SUB81((ulong)in_RDI >> 0x38,0));
    local_30 = (FormulaUnit *)process(in_stack_000002d8,in_stack_000002d0);
    if (this_00 != local_30) {
      Lib::List<Kernel::Unit_*>::push
                ((Unit *)in_stack_fffffffffffffef0,
                 (List<Kernel::Unit_*> **)in_stack_fffffffffffffee8);
      pFVar2 = (FormulaUnit *)Kernel::FormulaUnit::operator_new(0xb92ccb);
      local_85 = 1;
      Kernel::NonspecificInferenceMany::NonspecificInferenceMany
                (&local_78,FOOL_ELIMINATION,(UnitList *)in_RDI->_splits);
      Kernel::Inference::Inference((Inference *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8)
      ;
      Kernel::FormulaUnit::FormulaUnit
                (in_stack_ffffffffffffff40,(Formula *)in_stack_ffffffffffffff38,in_RDI);
      local_85 = 0;
      Kernel::Inference::~Inference(&local_68);
      local_38 = pFVar2;
      pLVar3 = Lib::List<Kernel::Unit_*>::empty();
      in_RDI->_splits = (SplitSet *)pLVar3;
      bVar1 = Shell::Options::showPreprocessing(in_stack_fffffffffffffef0);
      if (bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"[PP] ");
        Kernel::FormulaUnit::toString_abi_cxx11_(this_00);
        poVar4 = std::operator<<(poVar4,local_a8);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_a8);
        poVar4 = std::operator<<((ostream *)&std::cout,"[PP] ");
        Kernel::FormulaUnit::toString_abi_cxx11_(this_00);
        poVar4 = std::operator<<(poVar4,(string *)&stack0xffffffffffffff38);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
      }
      local_8 = local_38;
    }
  }
  return local_8;
}

Assistant:

FormulaUnit* FOOLElimination::apply(FormulaUnit* unit) {
  if (!needsElimination(unit)) {
    return unit;
  }

  FormulaUnit* rectifiedUnit = Rectify::rectify(unit);

  Formula* formula = rectifiedUnit->formula();

  _unit = rectifiedUnit;
  _varSorts.reset();

  SortHelper::collectVariableSorts(formula, _varSorts);

  Formula* processedFormula = process(formula);
  if (formula == processedFormula) {
    return rectifiedUnit;
  }

  // add the master premise to the definitions and pass them to the inference object
  UnitList::push(rectifiedUnit,_currentDefs);
  FormulaUnit* processedUnit = new FormulaUnit(processedFormula,
      NonspecificInferenceMany(InferenceRule::FOOL_ELIMINATION, _currentDefs));
  _currentDefs = UnitList::empty();

  if (env.options->showPreprocessing()) {
    std::cout << "[PP] " << unit->toString() << endl;
    std::cout << "[PP] " << processedUnit->toString()  << endl;
  }

  return processedUnit;
}